

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_ElementsNoSegwitAddressFromStringTest_Test::TestBody
          (Address_ElementsNoSegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  pointer __dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> params;
  Address address;
  string local_368;
  AssertHelper local_340;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  undefined1 local_330 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [16];
  pointer local_300;
  pointer local_2e8;
  pointer local_2d0;
  TapBranch local_2b8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_240;
  Script local_228;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1b8;
  Address local_1a0;
  
  cfd::core::Address::Address(&local_1a0);
  local_330 = (undefined1  [8])&local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]"
             ,"");
  cfd::core::AddressFormatData::ConvertListFromJson(&local_1b8,(string *)local_330);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_368,"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3","");
      cfd::core::Address::Address((Address *)local_330,&local_368,&local_1b8);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_330);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e8);
      cfd::core::Script::~Script(&local_228);
      local_2b8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_240);
      cfd::core::TapBranch::~TapBranch(&local_2b8);
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if (local_300 != (pointer)0x0) {
        operator_delete(local_300);
      }
      if ((undefined1 *)local_320._M_allocated_capacity != local_310) {
        operator_delete((void *)local_320._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2be,
               "Expected: (address = Address(\"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3\", params)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_330,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_368,"\"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3\"",
             "address.GetAddress().c_str()","2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",(char *)local_330)
  ;
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330);
  }
  if ((char)local_368._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_330);
    if ((undefined8 *)local_368._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_368._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2c0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_368._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p._0_4_ = 4;
  local_340.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_330,"NetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_368,(NetType *)&local_340);
  if (local_330[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_368);
    if (local_328.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_328.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2c2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_368._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p._0_4_ = 2;
  local_340.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_330,"AddressType::kP2pkhAddress","address.GetAddressType()",
             (AddressType *)&local_368,(AddressType *)&local_340);
  if (local_330[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_368);
    if (local_328.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_328.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2c6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_368._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_340.data_._0_4_ = local_1a0.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_330,"WitnessVersion::kVersionNone","address.GetWitnessVersion()",
             (WitnessVersion *)&local_368,(WitnessVersion *)&local_340);
  if (local_330[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_368);
    if (local_328.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_328.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2c7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_368._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = (pointer)0x0;
  local_368._M_string_length = 0;
  local_368.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    __dest = (pointer)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar3);
    sVar5 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_368.field_2._M_allocated_capacity = (size_type)(__dest + uVar3);
  local_368._M_dataplus._M_p = __dest;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_368._M_string_length = (size_type)__dest;
    memmove(__dest,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_368._M_string_length = (size_type)(__dest + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_330,(ByteData *)&local_368);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_340,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)local_330);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330);
  }
  if (local_368._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_340.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if (local_338.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_338.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2c9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_338,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p = (pointer)0x0;
  local_368._M_string_length = 0;
  local_368.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar3);
    sVar5 = (long)local_1a0.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_368.field_2._M_allocated_capacity = uVar3 + (long)paVar2;
  local_368._M_dataplus._M_p = (pointer)paVar2;
  if (local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_368._M_string_length = (size_type)paVar2;
    memmove(paVar2,local_1a0.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_368._M_string_length = (long)paVar2 + sVar5;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_330,(Pubkey *)&local_368);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_340,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)local_330);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_340.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if (local_338.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_338.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2ca,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_338,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_330,&local_1a0.redeem_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_368,(Script *)local_330);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_340,"\"\"","address.GetScript().GetHex().c_str()","",
             local_368._M_dataplus._M_p);
  paVar2 = &local_368.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_330);
  if (local_340.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if (local_338.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_338.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2cb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_338,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_368._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_368,"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA","");
      cfd::core::Address::Address((Address *)local_330,&local_368,&local_1b8);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_330);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e8);
      cfd::core::Script::~Script(&local_228);
      local_2b8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_240);
      cfd::core::TapBranch::~TapBranch(&local_2b8);
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if (local_300 != (pointer)0x0) {
        operator_delete(local_300);
      }
      if ((undefined1 *)local_320._M_allocated_capacity != local_310) {
        operator_delete((void *)local_320._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != paVar2) {
        operator_delete(local_368._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2cd,
               "Expected: (address = Address(\"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA\", params)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_330,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_368,"\"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA\"",
             "address.GetAddress().c_str()","XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA",(char *)local_330);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330);
  }
  if ((char)local_368._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_330);
    if ((undefined8 *)local_368._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_368._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2cf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if (local_330 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_330 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_368._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p._0_4_ = 4;
  local_340.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_330,"NetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_368,(NetType *)&local_340);
  if (local_330[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_368);
    if (local_328.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_328.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2d1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_368._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368._M_dataplus._M_p._0_4_ = 1;
  local_340.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_330,"AddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_368,(AddressType *)&local_340);
  if (local_330[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_368);
    if (local_328.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_328.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2d5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_368._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_368._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA","");
    cfd::core::Address::Address((Address *)local_330,&local_368);
    cfd::core::Address::operator=(&local_1a0,(Address *)local_330);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1e8);
    cfd::core::Script::~Script(&local_228);
    local_2b8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_240);
    cfd::core::TapBranch::~TapBranch(&local_2b8);
    if (local_2d0 != (pointer)0x0) {
      operator_delete(local_2d0);
    }
    if (local_2e8 != (pointer)0x0) {
      operator_delete(local_2e8);
    }
    if (local_300 != (pointer)0x0) {
      operator_delete(local_300);
    }
    if ((undefined1 *)local_320._M_allocated_capacity != local_310) {
      operator_delete((void *)local_320._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)local_330);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_368,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x2d9,
             "Expected: (address = Address(\"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_330);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
  if (local_330 != (undefined1  [8])0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_330 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_330 + 8))();
    }
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a0.format_data_);
  cfd::core::Script::~Script(&local_1a0.redeem_script_);
  local_1a0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006918c8;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a0.script_tree_.super_TapBranch);
  if (local_1a0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.address_._M_dataplus._M_p != &local_1a0.address_.field_2) {
    operator_delete(local_1a0.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, ElementsNoSegwitAddressFromStringTest) {
  Address address;
  std::vector<AddressFormatData> params = AddressFormatData::ConvertListFromJson(
      "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},"
      "{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]");

  // P2PKH
  EXPECT_NO_THROW((address = Address("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3", params)));
  EXPECT_STREQ("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersionNone, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA", params)));
  EXPECT_STREQ("XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  // analyze fail data
  EXPECT_THROW((address = Address("XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA")),
               CfdException);
}